

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::wheelEvent(Picker *this,QWheelEvent *event)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  
  if (*(long *)(event + 0x50) == 0) {
    uVar2 = *(ulong *)(event + 0x58);
    if (uVar2 == 0) goto LAB_001844fa;
    iVar3 = (int)((long)((ulong)(uint)((long)uVar2 >> 0x3f) << 0x20 | uVar2 >> 0x20) / 8);
  }
  else {
    iVar3 = (int)((ulong)*(long *)(event + 0x50) >> 0x20);
  }
  piVar1 = &((this->d).d)->drawItemOffset;
  *piVar1 = *piVar1 + iVar3;
  QWidget::update();
LAB_001844fa:
  event[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void
Picker::wheelEvent( QWheelEvent * event )
{
	QPoint numPixels = event->pixelDelta();
	QPoint numDegrees = event->angleDelta();

	if( !numPixels.isNull() )
	{
		d->drawItemOffset += numPixels.y();
		update();
	}
	else if( !numDegrees.isNull() )
	{
		d->drawItemOffset += numDegrees.y() / 8;
		update();
	}

	event->accept();
}